

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string_tests.cpp
# Opt level: O2

void util_string_tests::FailFmtWithError<0u>(string_view wrong_fmt,string_view error)

{
  char *extraout_RDX;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  string_view str;
  const_string file_00;
  check_type cVar1;
  char *local_c8;
  char *local_c0;
  lazy_ostream local_b8;
  undefined1 *local_a8;
  char *local_a0;
  assertion_result local_98;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  long local_30;
  
  str._M_len = wrong_fmt._M_str;
  local_38 = error._M_str;
  local_40 = error._M_len;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_string_tests.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = &DAT_0000001a;
  file.m_begin = (iterator)&local_50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  str._M_str = extraout_RDX;
  util::ConstevalFormatString<0U>::Detail_CheckNumFormatSpecifiers
            ((ConstevalFormatString<0U> *)wrong_fmt._M_len,str);
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_string_tests.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = &DAT_0000001a;
  file_00.m_begin = (iterator)&local_70;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_80,msg_00
            );
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b8.m_empty = false;
  local_b8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011398f0;
  local_a8 = boost::unit_test::lazy_ostream::inst;
  local_a0 = "exception ErrType expected but not raised";
  local_c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_string_tests.cpp"
  ;
  local_c0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_b8,1,1,WARN,_cVar1,(size_t)&local_c8,0x1a);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void FailFmtWithError(std::string_view wrong_fmt, std::string_view error)
{
    using ErrType = const char*;
    auto check_throw{[error](const ErrType& str) { return str == error; }};
    BOOST_CHECK_EXCEPTION(util::ConstevalFormatString<WrongNumArgs>::Detail_CheckNumFormatSpecifiers(wrong_fmt), ErrType, check_throw);
}